

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopFissionImpl::GroupInstructionsByUseDef(LoopFissionImpl *this)

{
  Loop *pLVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Op OVar6;
  BasicBlock *pBVar7;
  Instruction *this_00;
  reference pvVar8;
  size_type sVar9;
  mapped_type_conflict *pmVar10;
  size_type sVar11;
  size_type sVar12;
  reference pvVar13;
  iterator iVar14;
  iterator iVar15;
  ulong local_188;
  size_t index_1;
  ulong local_170;
  size_t index;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  inst_set;
  Instruction *local_130;
  Instruction *local_128;
  Instruction *inst_1;
  iterator __end3_1;
  iterator __begin3_1;
  BasicBlock *__range3_1;
  BasicBlock *block_1;
  iterator __end2_1;
  iterator __begin2_1;
  Function *__range2_1;
  Instruction *inst;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *block;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  instructions_to_ignore;
  Function *function;
  DebugScope local_48;
  Instruction *condition;
  BasicBlock *local_38;
  BasicBlock *condition_block;
  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  sets;
  LoopFissionImpl *this_local;
  
  sets.
  super__Vector_base<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &this->cloned_loop_instructions_;
  memset(&condition_block,0,0x18);
  std::
  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ::vector((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
            *)&condition_block);
  local_38 = Loop::FindConditionBlock(this->loop_);
  if (local_38 == (BasicBlock *)0x0) {
    this_local._7_1_ = false;
    condition._4_4_ = 1;
  }
  else {
    BasicBlock::tail((BasicBlock *)&function);
    local_48 = (DebugScope)
               utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&function);
    pBVar7 = Loop::GetHeaderBlock(this->loop_);
    instructions_to_ignore._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)BasicBlock::GetParent(pBVar7);
    memset(&__range2,0,0x30);
    std::
    set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::set((set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           *)&__range2);
    TraverseUseDef(this,(Instruction *)local_48,
                   (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2,true,true);
    sVar2 = instructions_to_ignore._M_t._M_impl.super__Rb_tree_header._M_node_count;
    join_0x00000010_0x00000000_ =
         Function::begin((Function *)
                         instructions_to_ignore._M_t._M_impl.super__Rb_tree_header._M_node_count);
    _block = Function::end((Function *)sVar2);
    while (bVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end2.iterator_,
                              (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block),
          sVar2 = instructions_to_ignore._M_t._M_impl.super__Rb_tree_header._M_node_count, bVar3) {
      pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_)
      ;
      pLVar1 = this->loop_;
      uVar4 = BasicBlock::id(pvVar8);
      bVar3 = Loop::IsInsideLoop(pLVar1,uVar4);
      if (bVar3) {
        BasicBlock::begin((BasicBlock *)&__end3);
        BasicBlock::end((BasicBlock *)&inst);
        while (bVar3 = utils::operator!=(&__end3.super_iterator,
                                         (iterator_template<spvtools::opt::Instruction> *)&inst),
              bVar3) {
          this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator)
          ;
          OVar6 = Instruction::opcode(this_00);
          if ((OVar6 == OpSelectionMerge) || (bVar3 = Instruction::IsBranch(this_00), bVar3)) {
            TraverseUseDef(this,this_00,
                           (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)&__range2,true,true);
          }
          InstructionList::iterator::operator++(&__end3);
        }
      }
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
    }
    join_0x00000010_0x00000000_ =
         Function::begin((Function *)
                         instructions_to_ignore._M_t._M_impl.super__Rb_tree_header._M_node_count);
    _block_1 = Function::end((Function *)sVar2);
    while (bVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end2_1.iterator_,
                              (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block_1),
          bVar3) {
      pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                          &__end2_1.iterator_);
      pLVar1 = this->loop_;
      uVar4 = BasicBlock::id(pvVar8);
      bVar3 = Loop::IsInsideLoop(pLVar1,uVar4);
      if (bVar3) {
        pBVar7 = Loop::GetHeaderBlock(this->loop_);
        uVar4 = BasicBlock::id(pBVar7);
        uVar5 = BasicBlock::id(pvVar8);
        if (uVar4 != uVar5) {
          BasicBlock::begin((BasicBlock *)&__end3_1);
          BasicBlock::end((BasicBlock *)&inst_1);
          while (bVar3 = utils::operator!=(&__end3_1.super_iterator,
                                           (iterator_template<spvtools::opt::Instruction> *)&inst_1)
                , bVar3) {
            local_128 = utils::IntrusiveList<spvtools::opt::Instruction>::
                        iterator_template<spvtools::opt::Instruction>::operator*
                                  (&__end3_1.super_iterator);
            OVar6 = Instruction::opcode(local_128);
            if ((OVar6 == OpLoad) || (OVar6 = Instruction::opcode(local_128), OVar6 == OpStore)) {
              sVar9 = std::
                      map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                      ::size(&this->instruction_order_);
              local_130 = local_128;
              pmVar10 = std::
                        map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                        ::operator[](&this->instruction_order_,&local_130);
              *pmVar10 = sVar9;
            }
            inst_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_128;
            sVar11 = std::
                     set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                     ::count(&this->seen_instructions_,
                             (key_type *)&inst_set._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
            if (sVar11 == 0) {
              memset(&index,0,0x30);
              std::
              set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::set((set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&index);
              TraverseUseDef(this,local_128,
                             (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                              *)&index,false,false);
              bVar3 = std::
                      set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                      ::empty((set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                               *)&index);
              if (!bVar3) {
                std::
                vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                ::push_back((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                             *)&condition_block,(value_type *)&index);
              }
              std::
              set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::~set((set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&index);
            }
            InstructionList::iterator::operator++(&__end3_1);
          }
        }
      }
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2_1.iterator_);
    }
    sVar12 = std::
             vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
             ::size((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                     *)&condition_block);
    if (sVar12 < 2) {
      this_local._7_1_ = false;
    }
    else {
      for (local_170 = 0;
          sVar12 = std::
                   vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                   ::size((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                           *)&condition_block), local_170 < sVar12 >> 1; local_170 = local_170 + 1)
      {
        pvVar13 = std::
                  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                  ::operator[]((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                                *)&condition_block,local_170);
        iVar14 = std::
                 set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::begin(pvVar13);
        pvVar13 = std::
                  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                  ::operator[]((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                                *)&condition_block,local_170);
        iVar15 = std::
                 set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::end(pvVar13);
        std::
        set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
        ::insert<std::_Rb_tree_const_iterator<spvtools::opt::Instruction*>>
                  ((set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                    *)this,(_Rb_tree_const_iterator<spvtools::opt::Instruction_*>)iVar14._M_node,
                   (_Rb_tree_const_iterator<spvtools::opt::Instruction_*>)iVar15._M_node);
      }
      sVar12 = std::
               vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
               ::size((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                       *)&condition_block);
      for (local_188 = sVar12 >> 1;
          sVar12 = std::
                   vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                   ::size((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                           *)&condition_block), local_188 < sVar12; local_188 = local_188 + 1) {
        pvVar13 = std::
                  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                  ::operator[]((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                                *)&condition_block,local_188);
        iVar14 = std::
                 set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::begin(pvVar13);
        pvVar13 = std::
                  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                  ::operator[]((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
                                *)&condition_block,local_188);
        iVar15 = std::
                 set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::end(pvVar13);
        std::
        set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
        ::insert<std::_Rb_tree_const_iterator<spvtools::opt::Instruction*>>
                  ((set<spvtools::opt::Instruction*,std::less<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                    *)&this->original_loop_instructions_,
                   (_Rb_tree_const_iterator<spvtools::opt::Instruction_*>)iVar14._M_node,
                   (_Rb_tree_const_iterator<spvtools::opt::Instruction_*>)iVar15._M_node);
      }
      this_local._7_1_ = true;
    }
    condition._4_4_ = 1;
    std::
    set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::~set((set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
            *)&__range2);
  }
  std::
  vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
  ::~vector((vector<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::allocator<std::set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
             *)&condition_block);
  return this_local._7_1_;
}

Assistant:

bool LoopFissionImpl::GroupInstructionsByUseDef() {
  std::vector<std::set<Instruction*>> sets{};

  // We want to ignore all the instructions stemming from the loop condition
  // instruction.
  BasicBlock* condition_block = loop_->FindConditionBlock();

  if (!condition_block) return false;
  Instruction* condition = &*condition_block->tail();

  // We iterate over the blocks via iterating over all the blocks in the
  // function, we do this so we are iterating in the same order which the blocks
  // appear in the binary.
  Function& function = *loop_->GetHeaderBlock()->GetParent();

  // Create a temporary set to ignore certain groups of instructions within the
  // loop. We don't want any instructions related to control flow to be removed
  // from either loop only instructions within the control flow bodies.
  std::set<Instruction*> instructions_to_ignore{};
  TraverseUseDef(condition, &instructions_to_ignore, true, true);

  // Traverse control flow instructions to ensure they are added to the
  // seen_instructions_ set and will be ignored when it it called with actual
  // sets.
  for (BasicBlock& block : function) {
    if (!loop_->IsInsideLoop(block.id())) continue;

    for (Instruction& inst : block) {
      // Ignore all instructions related to control flow.
      if (inst.opcode() == spv::Op::OpSelectionMerge || inst.IsBranch()) {
        TraverseUseDef(&inst, &instructions_to_ignore, true, true);
      }
    }
  }

  // Traverse the instructions and generate the sets, automatically ignoring any
  // instructions in instructions_to_ignore.
  for (BasicBlock& block : function) {
    if (!loop_->IsInsideLoop(block.id()) ||
        loop_->GetHeaderBlock()->id() == block.id())
      continue;

    for (Instruction& inst : block) {
      // Record the order that each load/store is seen.
      if (inst.opcode() == spv::Op::OpLoad ||
          inst.opcode() == spv::Op::OpStore) {
        instruction_order_[&inst] = instruction_order_.size();
      }

      // Ignore instructions already seen in a traversal.
      if (seen_instructions_.count(&inst) != 0) {
        continue;
      }

      // Build the set.
      std::set<Instruction*> inst_set{};
      TraverseUseDef(&inst, &inst_set);
      if (!inst_set.empty()) sets.push_back(std::move(inst_set));
    }
  }

  // If we have one or zero sets return false to indicate that due to
  // insufficient instructions we couldn't split the loop into two groups and
  // thus the loop can't be split any further.
  if (sets.size() < 2) {
    return false;
  }

  // Merge the loop sets into two different sets. In CanPerformSplit we will
  // validate that we don't break the relative ordering of loads/stores by doing
  // this.
  for (size_t index = 0; index < sets.size() / 2; ++index) {
    cloned_loop_instructions_.insert(sets[index].begin(), sets[index].end());
  }
  for (size_t index = sets.size() / 2; index < sets.size(); ++index) {
    original_loop_instructions_.insert(sets[index].begin(), sets[index].end());
  }

  return true;
}